

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer_scriptpubkeyman.cpp
# Opt level: O0

Result<void> * __thiscall
wallet::ExternalSignerScriptPubKeyMan::DisplayAddress
          (ExternalSignerScriptPubKeyMan *this,CTxDestination *dest,ExternalSigner *signer)

{
  string_view key;
  string_view key_00;
  undefined1 uVar1;
  undefined1 uVar2;
  __type_conflict _Var3;
  byte bVar4;
  pointer pDVar5;
  string *__rhs;
  long *in_RSI;
  Result<void> *in_RDI;
  long in_FS_OFFSET;
  UniValue *ret_address;
  UniValue *error;
  UniValue *result;
  CScript *scriptPubKey;
  unique_ptr<Descriptor,_std::default_delete<Descriptor>_> descriptor;
  unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_> provider;
  UniValue *in_stack_fffffffffffffcb8;
  Result<void> *in_stack_fffffffffffffcc0;
  string *in_stack_fffffffffffffcc8;
  SigningProvider *in_stack_fffffffffffffcd0;
  undefined7 in_stack_fffffffffffffcd8;
  undefined1 in_stack_fffffffffffffcdf;
  UniValue *in_stack_fffffffffffffce0;
  undefined7 in_stack_fffffffffffffce8;
  string *in_stack_fffffffffffffcf0;
  ExternalSigner *in_stack_fffffffffffffcf8;
  size_t in_stack_fffffffffffffd00;
  ConstevalStringLiteral in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd10;
  bilingual_str *fmt;
  undefined1 local_208 [296];
  undefined1 local_e0 [64];
  undefined1 local_a0 [32];
  bilingual_str local_80;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  GetScriptForDestination((CTxDestination *)in_stack_fffffffffffffcb8);
  (**(code **)(*in_RSI + 0xa8))(local_208,in_RSI,local_28);
  std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>::operator*
            ((unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_> *)
             in_stack_fffffffffffffcc8);
  InferDescriptor((CScript *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                  in_stack_fffffffffffffcd0);
  pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                     ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                      in_stack_fffffffffffffcb8);
  (*pDVar5->_vptr_Descriptor[4])(local_a0,pDVar5,0);
  ExternalSigner::DisplayAddress(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcb8);
  fmt = &local_80;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
             (char *)in_stack_fffffffffffffcd0);
  key._M_str = in_stack_fffffffffffffd08.lit;
  key._M_len = in_stack_fffffffffffffd00;
  UniValue::find_value(in_stack_fffffffffffffce0,key);
  uVar1 = UniValue::isStr(in_stack_fffffffffffffcb8);
  if ((bool)uVar1) {
    ::_((ConstevalStringLiteral)local_e0);
    UniValue::getValStr_abi_cxx11_(in_stack_fffffffffffffcb8);
    tinyformat::format<std::__cxx11::string>
              (fmt,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar1,in_stack_fffffffffffffd10));
    util::Result<void>::Result
              ((Result<void> *)in_stack_fffffffffffffcc8,(Error *)in_stack_fffffffffffffcc0);
    util::Error::~Error((Error *)in_stack_fffffffffffffcb8);
    bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffcb8);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
               (char *)in_stack_fffffffffffffcd0);
    key_00._M_str = in_stack_fffffffffffffd08.lit;
    key_00._M_len = in_stack_fffffffffffffd00;
    UniValue::find_value(in_stack_fffffffffffffce0,key_00);
    uVar2 = UniValue::isStr(in_stack_fffffffffffffcb8);
    if ((bool)uVar2) {
      __rhs = UniValue::getValStr_abi_cxx11_(in_stack_fffffffffffffcb8);
      EncodeDestination_abi_cxx11_((CTxDestination *)in_stack_fffffffffffffcc8);
      _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(uVar2,in_stack_fffffffffffffce8),__rhs);
      bVar4 = _Var3 ^ 0xff;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffcb8);
      if ((bVar4 & 1) == 0) {
        util::Result<void>::Result(in_stack_fffffffffffffcc0);
      }
      else {
        ::_(in_stack_fffffffffffffd08);
        in_stack_fffffffffffffcc8 = UniValue::getValStr_abi_cxx11_(in_stack_fffffffffffffcb8);
        tinyformat::format<std::__cxx11::string>
                  (fmt,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar1,in_stack_fffffffffffffd10));
        util::Result<void>::Result
                  ((Result<void> *)in_stack_fffffffffffffcc8,(Error *)in_stack_fffffffffffffcc0);
        util::Error::~Error((Error *)in_stack_fffffffffffffcb8);
        bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffcb8);
      }
    }
    else {
      ::_(in_stack_fffffffffffffd08);
      util::Result<void>::Result
                ((Result<void> *)in_stack_fffffffffffffcc8,(Error *)in_stack_fffffffffffffcc0);
      util::Error::~Error((Error *)in_stack_fffffffffffffcb8);
    }
  }
  UniValue::~UniValue(in_stack_fffffffffffffcb8);
  std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::~unique_ptr
            ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)in_stack_fffffffffffffcc8);
  _GLOBAL__N_1::std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>::~unique_ptr
            ((unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_> *)
             in_stack_fffffffffffffcc8);
  CScript::~CScript((CScript *)in_stack_fffffffffffffcb8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<void> ExternalSignerScriptPubKeyMan::DisplayAddress(const CTxDestination& dest, const ExternalSigner &signer) const
{
    // TODO: avoid the need to infer a descriptor from inside a descriptor wallet
    const CScript& scriptPubKey = GetScriptForDestination(dest);
    auto provider = GetSolvingProvider(scriptPubKey);
    auto descriptor = InferDescriptor(scriptPubKey, *provider);

    const UniValue& result = signer.DisplayAddress(descriptor->ToString());

    const UniValue& error = result.find_value("error");
    if (error.isStr()) return util::Error{strprintf(_("Signer returned error: %s"), error.getValStr())};

    const UniValue& ret_address = result.find_value("address");
    if (!ret_address.isStr()) return util::Error{_("Signer did not echo address")};

    if (ret_address.getValStr() != EncodeDestination(dest)) {
        return util::Error{strprintf(_("Signer echoed unexpected address %s"), ret_address.getValStr())};
    }

    return util::Result<void>();
}